

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objfile.c
# Opt level: O0

void read_obj_header(void)

{
  int iVar1;
  int iVar2;
  obj_header_t header;
  size_t in_stack_ffffffffffffffe8;
  uchar *in_stack_fffffffffffffff0;
  
  read_data(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  iVar1 = read_int32();
  iVar2 = strncmp(&stack0xfffffffffffffff4,"GBOBJECT",8);
  if (iVar2 != 0) {
    err(F,"invalid object file");
  }
  if (iVar1 != 1) {
    err(F,"object file format version not handled");
  }
  return;
}

Assistant:

void read_obj_header()
{
    obj_header_t header;
    read_data((unsigned char*)header.signature, 8);
    header.version = read_int32();
    if (strncmp((char*)header.signature, "GBOBJECT", 8) != 0)
        err(F, "invalid object file");
    if (header.version != 1)
        err(F, "object file format version not handled");
}